

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hq2x_16.cpp
# Opt level: O0

void Interp10(uchar *pc,int c1,int c2,int c3)

{
  int source;
  hq_vec *right;
  hq_vec local_38;
  hq_vec local_30;
  hq_vec local_28;
  hq_vec result;
  int c3_local;
  int c2_local;
  int c1_local;
  uchar *pc_local;
  
  result.m_value[0]._4_4_ = c3;
  hq_vec::load((hq_vec *)(ulong)(uint)c1,c1);
  source = 0xc40f38;
  hq_vec::operator*=(&local_28,&const14);
  hq_vec::load((hq_vec *)(ulong)(uint)c2,source);
  right = &local_30;
  hq_vec::operator+=(&local_28,right);
  hq_vec::load((hq_vec *)(ulong)result.m_value[0]._4_4_,(int)right);
  hq_vec::operator+=(&local_28,&local_38);
  hq_vec::operator>>(&local_28,4);
  hq_vec::store(&local_28,pc);
  return;
}

Assistant:

inline void Interp10(unsigned char * pc, int c1, int c2, int c3)
{
  // *((int*)pc) = (c1*14+c2+c3)/16;

  hq_vec result = hq_vec::load(c1);

  result *= const14;
  result += hq_vec::load(c2);
  result += hq_vec::load(c3);
  result >> 4;

  result.store(pc);
}